

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

bool __thiscall minja::Parser::consumeSpaces(Parser *this,SpaceHandling space_handling)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  if (space_handling == Strip) {
    pcVar1 = (this->end)._M_current;
    pcVar3 = (this->it)._M_current;
    while ((pcVar3 != pcVar1 && (iVar2 = isspace((int)*pcVar3), iVar2 != 0))) {
      pcVar3 = pcVar3 + 1;
      (this->it)._M_current = pcVar3;
    }
  }
  return true;
}

Assistant:

bool consumeSpaces(SpaceHandling space_handling = SpaceHandling::Strip) {
      if (space_handling == SpaceHandling::Strip) {
        while (it != end && std::isspace(*it)) ++it;
      }
      return true;
    }